

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

nifti_1_header * nifti_read_header(char *hname,int *swapped,int check)

{
  char *path;
  int iVar1;
  size_t sVar2;
  int local_1c4;
  char local_1b8 [8];
  char fname [18];
  char *hfile;
  int lswap;
  int bytes;
  znzFile fp;
  nifti_1_header *hptr;
  nifti_1_header nhdr;
  int check_local;
  int *swapped_local;
  char *hname_local;
  
  builtin_strncpy(local_1b8,"nifti_re",8);
  builtin_strncpy(fname,"ad_header",10);
  nhdr.intent_name._12_4_ = check;
  unique0x10000392 = swapped;
  register0x00000000 = nifti_findhdrname(hname);
  if (register0x00000000 == (char *)0x0) {
    if (0 < g_opts.debug) {
      fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1b8,"failed to find header file for",hname)
      ;
    }
    hname_local = (char *)0x0;
  }
  else {
    if (1 < g_opts.debug) {
      fprintf(_stderr,"-d %s: found header filename \'%s\'\n",local_1b8,register0x00000000);
    }
    path = stack0xfffffffffffffe60;
    iVar1 = nifti_is_gzfile(stack0xfffffffffffffe60);
    _lswap = znzopen(path,"rb",iVar1);
    if (_lswap == (znzFile)0x0) {
      if (0 < g_opts.debug) {
        fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1b8,"failed to open header file",
                stack0xfffffffffffffe60);
      }
      free(stack0xfffffffffffffe60);
      hname_local = (char *)0x0;
    }
    else {
      free(stack0xfffffffffffffe60);
      iVar1 = has_ascii_header(_lswap);
      if (iVar1 == 1) {
        Xznzclose((znzFile *)&lswap);
        if (0 < g_opts.debug) {
          fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1b8,"ASCII header type not supported",
                  hname);
        }
        hname_local = (char *)0x0;
      }
      else {
        sVar2 = znzread(&hptr,1,0x15c,_lswap);
        Xznzclose((znzFile *)&lswap);
        if ((int)sVar2 < 0x15c) {
          if (0 < g_opts.debug) {
            fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1b8,"bad binary header read for file"
                    ,hname);
            fprintf(_stderr,"  - read %d of %d bytes\n",sVar2 & 0xffffffff,0x15c);
          }
          hname_local = (char *)0x0;
        }
        else {
          hfile._0_4_ = need_nhdr_swap((short)nhdr.extents,(int)hptr);
          if ((nhdr.intent_name._12_4_ == 0) || (-1 < (int)hfile)) {
            if (((int)hfile < 0) && (hfile._0_4_ = 0, 1 < g_opts.debug)) {
              fprintf(_stderr,"-- swap failure, none applied\n");
            }
            if ((int)hfile != 0) {
              if (3 < g_opts.debug) {
                disp_nifti_1_header("-d nhdr pre-swap: ",(nifti_1_header *)&hptr);
              }
              if ((((nhdr.intent_name[8] == 'n') && (nhdr.intent_name[0xb] == '\0')) &&
                  ((nhdr.intent_name[9] == 'i' || (nhdr.intent_name[9] == '+')))) &&
                 (('0' < nhdr.intent_name[10] && (nhdr.intent_name[10] < ':')))) {
                local_1c4 = nhdr.intent_name[10] + -0x30;
              }
              else {
                local_1c4 = 0;
              }
              swap_nifti_header((nifti_1_header *)&hptr,local_1c4);
            }
            if (2 < g_opts.debug) {
              disp_nifti_1_header("-d nhdr post-swap: ",(nifti_1_header *)&hptr);
            }
            if ((nhdr.intent_name._12_4_ == 0) ||
               (iVar1 = nifti_hdr_looks_good((nifti_1_header *)&hptr), iVar1 != 0)) {
              fp = (znzFile)malloc(0x15c);
              if (fp == (znzFile)0x0) {
                fprintf(_stderr,"** nifti_read_hdr: failed to alloc nifti_1_header\n");
                hname_local = (char *)0x0;
              }
              else {
                if (stack0xffffffffffffffe0 != (int *)0x0) {
                  *stack0xffffffffffffffe0 = (int)hfile;
                }
                memcpy(fp,&hptr,0x15c);
                hname_local = (char *)fp;
              }
            }
            else {
              fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1b8,
                      "nifti_1_header looks bad for file",hname);
              hname_local = (char *)0x0;
            }
          }
          else {
            fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_1b8,"bad nifti_1_header for file",
                    hname);
            hname_local = (char *)0x0;
          }
        }
      }
    }
  }
  return (nifti_1_header *)hname_local;
}

Assistant:

nifti_1_header * nifti_read_header(const char * hname, int * swapped, int check)
{
   nifti_1_header   nhdr, * hptr;
   znzFile          fp;
   int              bytes, lswap;
   char           * hfile;
   char             fname[] = { "nifti_read_header" };

   /* determine file name to use for header */
   hfile = nifti_findhdrname(hname);
   if( hfile == NULL ){
      if( g_opts.debug > 0 )
         LNI_FERR(fname,"failed to find header file for", hname);
      return NULL;
   } else if( g_opts.debug > 1 )
      fprintf(stderr,"-d %s: found header filename '%s'\n",fname,hfile);

   fp = znzopen( hfile, "rb", nifti_is_gzfile(hfile) );
   if( znz_isnull(fp) ){
      if( g_opts.debug > 0 ) LNI_FERR(fname,"failed to open header file",hfile);
      free(hfile);
      return NULL;
   }

   free(hfile);  /* done with filename */

   if( has_ascii_header(fp) == 1 ){
      znzclose( fp );
      if( g_opts.debug > 0 )
         LNI_FERR(fname,"ASCII header type not supported",hname);
      return NULL;
   }

   /* read the binary header */
   bytes = (int)znzread( &nhdr, 1, sizeof(nhdr), fp );
   znzclose( fp );                      /* we are done with the file now */

   if( bytes < (int)sizeof(nhdr) ){
      if( g_opts.debug > 0 ){
         LNI_FERR(fname,"bad binary header read for file", hname);
         fprintf(stderr,"  - read %d of %d bytes\n",bytes, (int)sizeof(nhdr));
      }
      return NULL;
   }

   /* now just decide on byte swapping */
   lswap = need_nhdr_swap(nhdr.dim[0], nhdr.sizeof_hdr); /* swap data flag */
   if( check && lswap < 0 ){
      LNI_FERR(fname,"bad nifti_1_header for file", hname);
      return NULL;
   } else if ( lswap < 0 ) {
      lswap = 0;  /* if swapping does not help, don't do it */
      if(g_opts.debug > 1) fprintf(stderr,"-- swap failure, none applied\n");
   }

   if( lswap ) {
      if ( g_opts.debug > 3 ) disp_nifti_1_header("-d nhdr pre-swap: ", &nhdr);
      swap_nifti_header( &nhdr , NIFTI_VERSION(nhdr) ) ;
   }

   if ( g_opts.debug > 2 ) disp_nifti_1_header("-d nhdr post-swap: ", &nhdr);

   if ( check && ! nifti_hdr_looks_good(&nhdr) ){
      LNI_FERR(fname,"nifti_1_header looks bad for file", hname);
      return NULL;
   }

   /* all looks good, so allocate memory for and return the header */
   hptr = (nifti_1_header *)malloc(sizeof(nifti_1_header));
   if( ! hptr ){
      fprintf(stderr,"** nifti_read_hdr: failed to alloc nifti_1_header\n");
      return NULL;
   }

   if( swapped ) *swapped = lswap;  /* only if they care <sniff!> */

   memcpy(hptr, &nhdr, sizeof(nifti_1_header));

   return hptr;
}